

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

void __thiscall LexicalAnalyzer::endVariable(LexicalAnalyzer *this,string *str)

{
  pointer pbVar1;
  __type _Var2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    pbVar3 = (this->vStrSignsNotFirst).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->vStrSignsNotFirst).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pbVar3 != pbVar1) {
      std::__cxx11::string::string((string *)&temp,(string *)pbVar3);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
      _Var2 = std::operator==(&temp,&local_90);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&temp);
        return;
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      _Var2 = std::operator==(&temp,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&temp);
      pbVar3 = pbVar3 + 1;
      if (_Var2) {
        return;
      }
    }
    std::__cxx11::string::push_back((char)this + 'h');
    this->index = this->index + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::endVariable(string str){
    while(true){
        for(string temp : vStrSignsNotFirst){
            if((temp == str.substr(index,2) || (temp == str.substr(index,1))))
                return;
        }
        variable += str[index];
        index++;
    }
}